

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

future<void> __thiscall
ThreadPool::
enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int)>>
          (ThreadPool *this,
          _Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_long,_unsigned_long))(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_int,_unsigned_int)>
          *f)

{
  runtime_error *this_00;
  shared_ptr<std::packaged_task<void_()>_> *__args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  future<void> fVar1;
  unique_lock<std::mutex> lock;
  shared_ptr<std::packaged_task<void_()>_> task;
  future<void> *res;
  _Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_long,_unsigned_long))(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_int,_unsigned_int)>
  *in_stack_ffffffffffffff18;
  unique_lock<std::mutex> *in_stack_ffffffffffffff20;
  unique_lock<std::mutex> *this_01;
  _Bind<std::_Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_long,_unsigned_long))(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_int,_unsigned_int)>_()>
  *__args_00;
  unique_lock<std::mutex> local_a8 [3];
  undefined1 local_71;
  
  std::
  bind<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int)>>
            (in_stack_ffffffffffffff18);
  __args_00 = (_Bind<std::_Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_long,_unsigned_long))(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_int,_unsigned_int)>_()>
               *)&stack0xffffffffffffffd8;
  std::
  make_shared<std::packaged_task<void()>,std::_Bind<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int)>()>>
            (__args_00);
  local_71 = 0;
  std::__shared_ptr_access<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x19f636);
  std::packaged_task<void_()>::get_future((packaged_task<void_()> *)__args_00);
  std::unique_lock<std::mutex>::unique_lock
            (in_stack_ffffffffffffff20,(mutex_type *)in_stack_ffffffffffffff18);
  if ((*(byte *)(in_RSI + 0x118) & 1) == 0) {
    __args = (shared_ptr<std::packaged_task<void_()>_> *)(in_RSI + 0x18);
    this_01 = local_a8;
    std::shared_ptr<std::packaged_task<void_()>_>::shared_ptr
              ((shared_ptr<std::packaged_task<void_()>_> *)this_01,__args);
    std::
    queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
    ::
    emplace<ThreadPool::enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int)>>(std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int)>&&)::_lambda()_1_>
              ((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                *)this_01,(anon_class_16_1_8991e283 *)__args);
    enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int)>>(std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int)>&&)
    ::{lambda()#1}::~future((anon_class_16_1_8991e283 *)0x19f73d);
    std::unique_lock<std::mutex>::~unique_lock(this_01);
    std::condition_variable::notify_one();
    local_71 = 1;
    std::shared_ptr<std::packaged_task<void_()>_>::~shared_ptr
              ((shared_ptr<std::packaged_task<void_()>_> *)0x19f7a1);
    fVar1.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    fVar1.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         in_RDI;
    return (future<void>)
           fVar1.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"enqueue on stopped ThreadPool");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto ThreadPool::enqueue(F&& f, Args&&... args)
    -> std::future<typename std::result_of<F(Args...)>::type> {
  using return_type = typename std::result_of<F(Args...)>::type;
  auto task = std::make_shared< std::packaged_task<return_type()> >(
    std::bind(std::forward<F>(f), std::forward<Args>(args)...)
  );
  std::future<return_type> res = task->get_future();
  {
    std::unique_lock<std::mutex> lock(queue_mutex);
    // don't allow enqueueing after stopping the pool
    if (stop) {
      throw std::runtime_error("enqueue on stopped ThreadPool");
    }
    tasks.emplace([task](){ (*task)(); });
  }
  condition.notify_one();
  return res;
}